

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  N_Vector x_00;
  long in_RSI;
  int in_EDI;
  SUNContext sunctx;
  sunindextype n;
  sunindextype m;
  sunindextype j;
  sunindextype i;
  int square;
  int print_timing;
  sunrealtype *Idata;
  sunrealtype *Adata;
  SUNMatrix I;
  SUNMatrix A;
  sunrealtype *ydata;
  sunrealtype *xdata;
  N_Vector y;
  N_Vector x;
  sunindextype matcols;
  sunindextype matrows;
  int fails;
  undefined8 local_98;
  long local_90;
  SUNMatrix local_88;
  long lVar11;
  int myid;
  long lVar12;
  long lVar13;
  SUNMatrix A_00;
  N_Vector in_stack_ffffffffffffff98;
  SUNMatrix A_01;
  int local_14;
  uint local_4;
  
  iVar1 = SUNContext_Create(0,&local_98);
  if (iVar1 == 0) {
    if (in_EDI < 4) {
      printf("ERROR: THREE (3) Input required: matrix rows, matrix cols, print timing \n");
      local_4 = 0xffffffff;
    }
    else {
      lVar6 = atol(*(char **)(in_RSI + 8));
      if (lVar6 < 1) {
        printf("ERROR: number of rows must be a positive integer \n");
        local_4 = 0xffffffff;
      }
      else {
        lVar7 = atol(*(char **)(in_RSI + 0x10));
        if (lVar7 < 1) {
          printf("ERROR: number of cols must be a positive integer \n");
          local_4 = 0xffffffff;
        }
        else {
          iVar1 = atoi(*(char **)(in_RSI + 0x18));
          SetTiming(iVar1);
          uVar2 = (uint)(lVar6 == lVar7);
          printf("\nDense matrix test: size %ld by %ld\n\n",lVar6,lVar7);
          uVar8 = N_VNew_Serial(lVar7,local_98);
          uVar9 = N_VNew_Serial(lVar6,local_98);
          uVar10 = SUNDenseMatrix(lVar6,lVar7,local_98);
          A_01 = (SUNMatrix)0x0;
          if (uVar2 != 0) {
            A_01 = (SUNMatrix)SUNDenseMatrix(lVar6,lVar7,local_98);
          }
          x_00 = (N_Vector)SUNDenseMatrix_Data(uVar10);
          for (lVar11 = 0; lVar11 < lVar7; lVar11 = lVar11 + 1) {
            for (lVar12 = 0; lVar12 < lVar6; lVar12 = lVar12 + 1) {
              (&x_00->content)[lVar11 * lVar6 + lVar12] =
                   (void *)(double)((lVar11 + 1) * (lVar12 + lVar11));
            }
          }
          if (uVar2 != 0) {
            in_stack_ffffffffffffff98 = (N_Vector)SUNDenseMatrix_Data(A_01);
            lVar11 = 0;
            for (lVar12 = 0; lVar12 < lVar6; lVar12 = lVar12 + 1) {
              (&in_stack_ffffffffffffff98->content)[lVar11 * lVar6 + lVar12] =
                   (void *)0x3ff0000000000000;
              lVar11 = lVar11 + 1;
            }
          }
          lVar12 = N_VGetArrayPointer(uVar8);
          for (lVar13 = 0; lVar13 < lVar7; lVar13 = lVar13 + 1) {
            *(double *)(lVar12 + lVar13 * 8) = 1.0 / (double)(lVar13 + 1);
          }
          lVar12 = N_VGetArrayPointer(uVar9);
          for (A_00 = (SUNMatrix)0x0; (long)A_00 < lVar6;
              A_00 = (SUNMatrix)((long)&A_00->content + 1)) {
            local_90 = (long)A_00 + lVar7 + -1;
            *(double *)(lVar12 + (long)A_00 * 8) =
                 (double)lVar7 * 0.5 * (double)(local_90 + (long)A_00);
            local_88 = A_00;
          }
          iVar3 = Test_SUNMatGetID(A_00,(SUNMatrix_ID)((ulong)lVar11 >> 0x20),(int)lVar11);
          myid = (int)((ulong)lVar11 >> 0x20);
          iVar4 = Test_SUNMatClone(A_00,myid);
          iVar5 = Test_SUNMatCopy(A_00,myid);
          local_14 = Test_SUNMatZero(A_00,myid);
          local_14 = local_14 + iVar5 + iVar4 + iVar3;
          if (uVar2 != 0) {
            iVar3 = Test_SUNMatScaleAdd(A_01,(SUNMatrix)x_00,
                                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
            iVar4 = Test_SUNMatScaleAddI
                              ((SUNMatrix)in_stack_ffffffffffffff98,(SUNMatrix)CONCAT44(iVar1,uVar2)
                               ,(int)((ulong)A_00 >> 0x20));
            local_14 = iVar4 + iVar3 + local_14;
          }
          iVar1 = Test_SUNMatMatvec(A_01,x_00,in_stack_ffffffffffffff98,iVar1);
          iVar3 = Test_SUNMatSpace(A_00,myid);
          local_4 = iVar3 + iVar1 + local_14;
          if (local_4 == 0) {
            printf("SUCCESS: SUNMatrix module passed all tests \n \n");
          }
          else {
            printf("FAIL: SUNMatrix module failed %i tests \n \n",(ulong)local_4);
            printf("\nA =\n");
            SUNDenseMatrix_Print(uVar10,_stdout);
            if (uVar2 != 0) {
              printf("\nI =\n");
              SUNDenseMatrix_Print(A_01,_stdout);
            }
            printf("\nx =\n");
            N_VPrint_Serial(uVar8);
            printf("\ny =\n");
            N_VPrint_Serial(uVar9);
          }
          N_VDestroy(uVar8);
          N_VDestroy(uVar9);
          SUNMatDestroy(uVar10);
          if (uVar2 != 0) {
            SUNMatDestroy(A_01);
          }
          SUNContext_Free(&local_98);
        }
      }
    }
  }
  else {
    printf("ERROR: SUNContext_Create failed\n");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;                 /* counter for test failures  */
  sunindextype matrows, matcols; /* vector length              */
  N_Vector x, y;                 /* test vectors               */
  sunrealtype *xdata, *ydata;    /* pointers to vector data    */
  SUNMatrix A, I;                /* test matrices              */
  sunrealtype *Adata, *Idata;    /* pointers to matrix data    */
  int print_timing, square;
  sunindextype i, j, m, n;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check input and set vector length */
  if (argc < 4)
  {
    printf("ERROR: THREE (3) Input required: matrix rows, matrix cols, print "
           "timing \n");
    return (-1);
  }

  matrows = (sunindextype)atol(argv[1]);
  if (matrows <= 0)
  {
    printf("ERROR: number of rows must be a positive integer \n");
    return (-1);
  }

  matcols = (sunindextype)atol(argv[2]);
  if (matcols <= 0)
  {
    printf("ERROR: number of cols must be a positive integer \n");
    return (-1);
  }

  print_timing = atoi(argv[3]);
  SetTiming(print_timing);

  square = (matrows == matcols) ? 1 : 0;
  printf("\nDense matrix test: size %ld by %ld\n\n", (long int)matrows,
         (long int)matcols);

  /* Initialize vectors and matrices to NULL */
  x = NULL;
  y = NULL;
  A = NULL;
  I = NULL;

  /* Create vectors and matrices */
  x = N_VNew_Serial(matcols, sunctx);
  y = N_VNew_Serial(matrows, sunctx);
  A = SUNDenseMatrix(matrows, matcols, sunctx);
  I = NULL;
  if (square) { I = SUNDenseMatrix(matrows, matcols, sunctx); }

  /* Fill matrices and vectors */
  Adata = SUNDenseMatrix_Data(A);
  for (j = 0; j < matcols; j++)
  {
    for (i = 0; i < matrows; i++)
    {
      Adata[j * matrows + i] = (j + 1) * (i + j);
    }
  }

  if (square)
  {
    Idata = SUNDenseMatrix_Data(I);
    for (i = 0, j = 0; i < matrows; i++, j++) { Idata[j * matrows + i] = ONE; }
  }

  xdata = N_VGetArrayPointer(x);
  for (i = 0; i < matcols; i++) { xdata[i] = ONE / (i + 1); }

  ydata = N_VGetArrayPointer(y);
  for (i = 0; i < matrows; i++)
  {
    m        = i;
    n        = m + matcols - 1;
    ydata[i] = HALF * (n + 1 - m) * (n + m);
  }

  /* SUNMatrix Tests */
  fails += Test_SUNMatGetID(A, SUNMATRIX_DENSE, 0);
  fails += Test_SUNMatClone(A, 0);
  fails += Test_SUNMatCopy(A, 0);
  fails += Test_SUNMatZero(A, 0);
  if (square)
  {
    fails += Test_SUNMatScaleAdd(A, I, 0);
    fails += Test_SUNMatScaleAddI(A, I, 0);
  }
  fails += Test_SUNMatMatvec(A, x, y, 0);
  fails += Test_SUNMatSpace(A, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNMatrix module failed %i tests \n \n", fails);
    printf("\nA =\n");
    SUNDenseMatrix_Print(A, stdout);
    if (square)
    {
      printf("\nI =\n");
      SUNDenseMatrix_Print(I, stdout);
    }
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
  }
  else { printf("SUCCESS: SUNMatrix module passed all tests \n \n"); }

  /* Free vectors and matrices */
  N_VDestroy(x);
  N_VDestroy(y);
  SUNMatDestroy(A);
  if (square) { SUNMatDestroy(I); }
  SUNContext_Free(&sunctx);

  return (fails);
}